

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

bool __thiscall toml::internal::Parser::parseKeyValue(Parser *this,Value *current)

{
  bool bVar1;
  Value v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string key;
  
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  bVar1 = parseKey(this,&key);
  if (bVar1) {
    bVar1 = consumeForValue(this,EQUAL);
    if (bVar1) {
      v.type_ = NULL_TYPE;
      v.field_1.null_ = (void *)0x0;
      bVar1 = parseValue(this,&v);
      if (bVar1) {
        bVar1 = consumeEOLorEOFForKey(this);
        if (!bVar1) goto LAB_0012fa68;
        bVar1 = Value::has(current,&key);
        if (bVar1) {
          std::operator+(&local_50,"Multiple same key: ",&key);
          addError(this,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          goto LAB_0012fa68;
        }
        bVar1 = true;
        Value::setChild(current,&key,&v);
      }
      else {
LAB_0012fa68:
        bVar1 = false;
      }
      Value::~Value(&v);
      goto LAB_0012faca;
    }
    std::__cxx11::string::string((string *)&local_50,"no equal?",(allocator *)&v);
    addError(this,&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"parse key failed",(allocator *)&v);
    addError(this,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = false;
LAB_0012faca:
  std::__cxx11::string::~string((string *)&key);
  return bVar1;
}

Assistant:

inline bool Parser::parseKeyValue(Value* current)
{
    std::string key;
    if (!parseKey(&key)) {
        addError("parse key failed");
        return false;
    }
    if (!consumeForValue(TokenType::EQUAL)) {
        addError("no equal?");
        return false;
    }

    Value v;
    if (!parseValue(&v))
        return false;
    if (!consumeEOLorEOFForKey())
        return false;

    if (current->has(key)) {
        addError("Multiple same key: " + key);
        return false;
    }

    current->setChild(key, std::move(v));
    return true;
}